

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void applyNumericAffinity(Mem *pRec,int bTryForInt)

{
  u8 enc;
  undefined2 uVar1;
  undefined2 uVar2;
  char *z;
  ushort uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  double rValue;
  double local_30;
  
  z = pRec->z;
  iVar5 = pRec->n;
  enc = pRec->enc;
  iVar4 = sqlite3AtoF(z,&local_30,iVar5,enc);
  if (iVar4 < 1) {
    return;
  }
  if (iVar4 == 1) {
    lVar6 = 0x7fffffffffffffff;
    if (-9.223372036854775e+18 <= local_30) {
      if (local_30 <= 9.223372036854775e+18) {
        lVar6 = (long)local_30;
      }
    }
    else {
      lVar6 = -0x8000000000000000;
    }
    if (((local_30 == 0.0) && (!NAN(local_30))) ||
       ((0xffe < (uint)((ulong)(lVar6 + -0x8000000000000) >> 0x34) && (local_30 == (double)lVar6))))
    {
      (pRec->u).i = lVar6;
    }
    else {
      iVar5 = sqlite3Atoi64(z,(i64 *)pRec,iVar5,enc);
      if (iVar5 != 0) goto LAB_0011efa8;
    }
    uVar1 = pRec->flags;
    uVar3 = uVar1 | 4;
  }
  else {
LAB_0011efa8:
    (pRec->u).r = local_30;
    uVar2 = pRec->flags;
    uVar3 = uVar2 | 8;
    pRec->flags = uVar3;
    if (bTryForInt != 0) {
      sqlite3VdbeIntegerAffinity(pRec);
      uVar3 = pRec->flags;
    }
  }
  pRec->flags = uVar3 & 0xfffd;
  return;
}

Assistant:

static void applyNumericAffinity(Mem *pRec, int bTryForInt){
  double rValue;
  u8 enc = pRec->enc;
  int rc;
  assert( (pRec->flags & (MEM_Str|MEM_Int|MEM_Real|MEM_IntReal))==MEM_Str );
  rc = sqlite3AtoF(pRec->z, &rValue, pRec->n, enc);
  if( rc<=0 ) return;
  if( rc==1 && alsoAnInt(pRec, rValue, &pRec->u.i) ){
    pRec->flags |= MEM_Int;
  }else{
    pRec->u.r = rValue;
    pRec->flags |= MEM_Real;
    if( bTryForInt ) sqlite3VdbeIntegerAffinity(pRec);
  }
  /* TEXT->NUMERIC is many->one.  Hence, it is important to invalidate the
  ** string representation after computing a numeric equivalent, because the
  ** string representation might not be the canonical representation for the
  ** numeric value.  Ticket [343634942dd54ab57b7024] 2018-01-31. */
  pRec->flags &= ~MEM_Str;
}